

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O3

LPVOID __thiscall
Memory::PreReservedVirtualAllocWrapper::GetPreReservedEndAddress
          (PreReservedVirtualAllocWrapper *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  LPVOID pvVar5;
  undefined8 *in_FS_OFFSET;
  
  pvVar5 = this->preReservedStartAddress;
  if (pvVar5 == (LPVOID)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0xb7,"(IsPreReservedRegionPresent())","IsPreReservedRegionPresent()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    pvVar5 = this->preReservedStartAddress;
  }
  uVar4 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
  return (LPVOID)((ulong)(uVar4 << 0x18) + (long)pvVar5);
}

Assistant:

LPVOID
PreReservedVirtualAllocWrapper::GetPreReservedEndAddress()
{
    Assert(IsPreReservedRegionPresent());
    return GetPreReservedEndAddress(preReservedStartAddress);
}